

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint crnlib::symbol_codec::encode_truncated_binary_cost(uint v,uint n)

{
  uint u;
  uint k;
  uint n_local;
  uint v_local;
  
  n_local = math::floor_log2i(n);
  if ((1 << ((char)n_local + 1U & 0x1f)) - n <= v) {
    n_local = n_local + 1;
  }
  return n_local;
}

Assistant:

uint symbol_codec::encode_truncated_binary_cost(uint v, uint n)
    {
        CRNLIB_ASSERT((n >= 2) && (v < n));

        uint k = math::floor_log2i(n);
        uint u = (1 << (k + 1)) - n;

        if (v < u)
        {
            return k;
        }
        else
        {
            return k + 1;
        }
    }